

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline_listener.c
# Opt level: O1

HT_TimelineListenerContainer * ht_find_or_create_listener(char *name)

{
  HT_TimelineListenerEntry *pHVar1;
  HT_Mutex *pHVar2;
  HT_TimelineListenerContainer *pHVar3;
  
  if (name != (char *)0x0) {
    pHVar3 = ht_registry_find_listener_container(name);
    if (pHVar3 == (HT_TimelineListenerContainer *)0x0) {
      pHVar3 = ht_timeline_listener_container_create();
      if (pHVar3 == (HT_TimelineListenerContainer *)0x0) {
        pHVar3 = (HT_TimelineListenerContainer *)0x0;
      }
      else {
        ht_registry_register_listener_container(name,pHVar3);
      }
    }
    else {
      pHVar3->refcount = pHVar3->refcount + 1;
    }
    return pHVar3;
  }
  pHVar3 = (HT_TimelineListenerContainer *)ht_alloc(0x30);
  if (pHVar3 != (HT_TimelineListenerContainer *)0x0) {
    pHVar1 = (HT_TimelineListenerEntry *)ht_alloc(0x180);
    (pHVar3->entries).data = pHVar1;
    if (pHVar1 != (HT_TimelineListenerEntry *)0x0) {
      (pHVar3->entries).min_capacity = 0x10;
      (pHVar3->entries).capacity = 0x10;
      (pHVar3->entries).size = 0;
      pHVar2 = ht_mutex_create();
      pHVar3->mutex = pHVar2;
      if (pHVar2 != (HT_Mutex *)0x0) {
        pHVar3->id = 0;
        pHVar3->refcount = 1;
        return pHVar3;
      }
      ht_free((pHVar3->entries).data);
      (pHVar3->entries).capacity = 0;
      (pHVar3->entries).size = 0;
      (pHVar3->entries).data = (HT_TimelineListenerEntry *)0x0;
    }
    ht_free(pHVar3);
  }
  return (HT_TimelineListenerContainer *)0x0;
}

Assistant:

HT_TimelineListenerContainer*
ht_find_or_create_listener(const char* name)
{
    HT_TimelineListenerContainer* container;

    if (name == NULL)
    {
        container = ht_timeline_listener_container_create();
    }
    else
    {
        container = ht_registry_find_listener_container(name);
        if (container == NULL)
        {
            container = ht_timeline_listener_container_create();
            if (container != NULL)
            {
                ht_registry_register_listener_container(name, container);
            }
        }
        else
        {
            container->refcount++;
        }
    }

    return container;
}